

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O1

FT_Error load_post_names(TT_Face face)

{
  byte bVar1;
  FT_Stream stream;
  long lVar2;
  FT_UInt16 FVar3;
  FT_UInt16 FVar4;
  FT_Error FVar5;
  int iVar6;
  FT_UShort *pFVar7;
  FT_Char **P;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  FT_Memory pFVar12;
  ulong uVar13;
  FT_Byte *P_00;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  FT_ULong post_len;
  uint local_5c;
  FT_UShort *local_58;
  FT_Byte *local_50;
  FT_Memory local_48;
  ulong local_40;
  ulong local_38;
  
  stream = (face->root).stream;
  FVar5 = (*face->goto_table)(face,0x706f7374,stream,&local_38);
  if (FVar5 != 0) {
    return FVar5;
  }
  lVar2 = (face->postscript).FormatType;
  FVar5 = FT_Stream_Skip(stream,0x20);
  if (FVar5 != 0) {
    return FVar5;
  }
  if (local_38 < 0x22 || lVar2 != 0x20000) {
    uVar14 = 3;
    if (lVar2 != 0x25000 || local_38 < 0x22) goto LAB_0024e877;
    pFVar12 = stream->memory;
    FVar3 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_5c);
    uVar14 = local_5c;
    if (local_5c != 0) goto LAB_0024e877;
    uVar13 = (ulong)FVar3;
    if ((0x102 < FVar3) || ((face->max_profile).numGlyphs <= (ushort)(FVar3 - 1)))
    goto LAB_0024e835;
    pFVar7 = (FT_UShort *)ft_mem_qrealloc(pFVar12,1,0,uVar13,(void *)0x0,(FT_Error *)&local_5c);
    if ((local_5c == 0) &&
       (local_5c = FT_Stream_Read(stream,(FT_Byte *)pFVar7,uVar13), local_5c == 0)) {
      if (FVar3 != 0) {
        uVar15 = 0;
        do {
          if (uVar13 < (long)(char)*(FT_Byte *)((long)pFVar7 + uVar15) + uVar15) {
            local_5c = 3;
            iVar6 = 3;
            goto LAB_0024e8b9;
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      iVar6 = 0;
LAB_0024e8b9:
      if (iVar6 != 3) {
        uVar14 = (uint)FVar3;
        if (iVar6 == 0) {
          (face->postscript_names).names.format_20.num_glyphs = FVar3;
          (face->postscript_names).names.format_25.offsets = (FT_Char *)pFVar7;
          uVar14 = 0;
        }
        goto LAB_0024e877;
      }
    }
LAB_0024e86d:
    ft_mem_free(pFVar12,pFVar7);
    uVar14 = local_5c;
  }
  else {
    pFVar12 = stream->memory;
    FVar3 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_5c);
    uVar14 = local_5c;
    if (local_5c != 0) goto LAB_0024e877;
    if (FVar3 <= (face->max_profile).numGlyphs) {
      uVar8 = (ulong)FVar3;
      uVar14 = (uint)FVar3 + (uint)FVar3;
      uVar15 = (ulong)uVar14;
      uVar13 = (local_38 - 0x22) - uVar15;
      if (uVar15 <= local_38 - 0x22) {
        local_48 = pFVar12;
        pFVar7 = (FT_UShort *)ft_mem_qrealloc(pFVar12,2,0,uVar8,(void *)0x0,(FT_Error *)&local_5c);
        iVar6 = 3;
        if (local_5c == 0) {
          local_5c = FT_Stream_EnterFrame(stream,uVar15);
          iVar6 = 3;
          if (local_5c == 0) {
            if (FVar3 != 0) {
              uVar15 = 0;
              do {
                FVar4 = FT_Stream_GetUShort(stream);
                pFVar7[uVar15] = FVar4;
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            uVar14 = (uint)uVar15;
            FT_Stream_ExitFrame(stream);
            iVar6 = 0;
          }
        }
        local_58 = pFVar7;
        if (iVar6 != 3) {
          if (iVar6 != 0) goto LAB_0024e877;
          if (FVar3 == 0) {
            uVar10 = 0;
          }
          else {
            uVar15 = 0;
            uVar14 = 0;
            do {
              uVar11 = pFVar7[uVar15] - 0x101;
              uVar9 = uVar14 & 0xffff;
              if ((int)uVar11 <= (int)uVar9) {
                uVar11 = uVar9;
              }
              uVar14 = uVar11;
              if (pFVar7[uVar15] < 0x102) {
                uVar14 = uVar9;
              }
              uVar10 = (ushort)uVar14;
              uVar15 = uVar15 + 1;
            } while (uVar8 != uVar15);
          }
          uVar14 = 0;
          if (uVar10 == 0) {
            P = (FT_Char **)0x0;
          }
          else {
            local_50 = (FT_Byte *)ft_mem_qalloc(local_48,uVar13 + 1,(FT_Error *)&local_5c);
            iVar6 = 3;
            if (local_5c == 0) {
              local_5c = FT_Stream_Read(stream,local_50,uVar13);
              if (local_5c == 0) {
                local_40 = (ulong)uVar10;
                P = (FT_Char **)
                    ft_mem_qrealloc(local_48,8,0,local_40,(void *)0x0,(FT_Error *)&local_5c);
                if (local_5c == 0) {
                  uVar15 = 0;
                  if (uVar13 == 0) {
                    bVar16 = true;
                  }
                  else {
                    uVar15 = 0;
                    uVar8 = 0;
                    do {
                      bVar1 = local_50[uVar8];
                      if ((ulong)bVar1 < 0x40) {
                        local_50[uVar8] = '\0';
                        P[uVar15] = (FT_Char *)(local_50 + uVar8 + 1);
                        uVar8 = uVar8 + bVar1 + 1;
                        iVar6 = 0;
                      }
                      else {
                        local_5c = 3;
                        iVar6 = 3;
                      }
                      if (0x3f < bVar1) goto LAB_0024e97b;
                      uVar15 = uVar15 + 1;
                      bVar16 = uVar15 < local_40;
                    } while ((uVar8 < uVar13) && (uVar15 < local_40));
                  }
                  local_50[uVar13] = '\0';
                  if (bVar16) {
                    if (uVar13 == 0) {
                      uVar13 = 1;
                      local_50 = (FT_Byte *)
                                 ft_mem_qrealloc(local_48,1,1,2,local_50,(FT_Error *)&local_5c);
                      if (local_5c != 0) goto LAB_0024e96c;
                      local_50[1] = '\0';
                    }
                    if ((ushort)uVar15 < uVar10) {
                      uVar15 = uVar15 & 0xffff;
                      do {
                        P[uVar15] = (FT_Char *)(local_50 + uVar13);
                        uVar15 = uVar15 + 1;
                      } while (local_40 != uVar15);
                    }
                  }
                  iVar6 = 0;
                  goto LAB_0024e97b;
                }
              }
              else {
                P = (FT_Char **)0x0;
              }
LAB_0024e96c:
              iVar6 = 3;
            }
            else {
              P = (FT_Char **)0x0;
            }
LAB_0024e97b:
            P_00 = local_50;
            if (iVar6 == 3) goto LAB_0024e84a;
            pFVar7 = local_58;
            if (iVar6 != 0) goto LAB_0024e877;
          }
          (face->postscript_names).names.format_20.num_glyphs = FVar3;
          (face->postscript_names).names.format_20.num_names = uVar10;
          (face->postscript_names).names.format_20.glyph_indices = pFVar7;
          (face->postscript_names).names.format_20.glyph_names = P;
          goto LAB_0024e877;
        }
        P = (FT_Char **)0x0;
        P_00 = (FT_Byte *)0x0;
LAB_0024e84a:
        pFVar12 = local_48;
        ft_mem_free(local_48,P);
        ft_mem_free(pFVar12,P_00);
        pFVar7 = local_58;
        goto LAB_0024e86d;
      }
    }
LAB_0024e835:
    local_5c = 3;
    uVar14 = local_5c;
  }
LAB_0024e877:
  (face->postscript_names).loaded = '\x01';
  return uVar14;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L && post_len >= 34 )
      error = load_format_20( face, stream, post_len - 32 );
    else if ( format == 0x00025000L && post_len >= 34 )
      error = load_format_25( face, stream, post_len - 32 );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }